

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralocal.cpp
# Opt level: O2

int __thiscall asmjit::RALocalAllocator::init(RALocalAllocator *this,EVP_PKEY_CTX *ctx)

{
  PhysToWorkMap *pPVar1;
  WorkToPhysMap *pWVar2;
  int iVar3;
  
  pPVar1 = BaseRAPass::newPhysToWorkMap(this->_pass);
  pWVar2 = BaseRAPass::newWorkToPhysMap(this->_pass);
  iVar3 = 1;
  if (pWVar2 != (WorkToPhysMap *)0x0 && pPVar1 != (PhysToWorkMap *)0x0) {
    RAAssignment::initLayout
              (&this->_curAssignment,&this->_pass->_physRegCount,&this->_pass->_workRegs);
    RAAssignment::initMaps(&this->_curAssignment,pPVar1,pWVar2);
    pPVar1 = BaseRAPass::newPhysToWorkMap(this->_pass);
    pWVar2 = BaseRAPass::newWorkToPhysMap(this->_pass);
    if (pWVar2 != (WorkToPhysMap *)0x0 && pPVar1 != (PhysToWorkMap *)0x0) {
      RAAssignment::initLayout
                (&this->_tmpAssignment,&this->_pass->_physRegCount,&this->_pass->_workRegs);
      RAAssignment::initMaps(&this->_tmpAssignment,pPVar1,pWVar2);
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

Error RALocalAllocator::init() noexcept {
  PhysToWorkMap* physToWorkMap;
  WorkToPhysMap* workToPhysMap;

  physToWorkMap = _pass->newPhysToWorkMap();
  workToPhysMap = _pass->newWorkToPhysMap();
  if (!physToWorkMap || !workToPhysMap)
    return DebugUtils::errored(kErrorOutOfMemory);

  _curAssignment.initLayout(_pass->_physRegCount, _pass->workRegs());
  _curAssignment.initMaps(physToWorkMap, workToPhysMap);

  physToWorkMap = _pass->newPhysToWorkMap();
  workToPhysMap = _pass->newWorkToPhysMap();
  if (!physToWorkMap || !workToPhysMap)
    return DebugUtils::errored(kErrorOutOfMemory);

  _tmpAssignment.initLayout(_pass->_physRegCount, _pass->workRegs());
  _tmpAssignment.initMaps(physToWorkMap, workToPhysMap);

  return kErrorOk;
}